

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall QWidgetTextControlPrivate::createAutoBulletList(QWidgetTextControlPrivate *this)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QTextCursor::beginEditBlock();
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::blockFormat();
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QTextListFormat::QTextListFormat((QTextListFormat *)&local_68);
  ::QVariant::QVariant(&local_48,-1);
  QTextFormat::setProperty((int)&local_68,(QVariant *)0x3000);
  ::QVariant::~QVariant(&local_48);
  iVar2 = (int)(QTextFormat *)&local_58;
  iVar1 = QTextFormat::intProperty(iVar2);
  ::QVariant::QVariant(&local_48,iVar1 + 1);
  QTextFormat::setProperty((int)&local_68,(QVariant *)0x3001);
  ::QVariant::~QVariant(&local_48);
  ::QVariant::QVariant(&local_48,0);
  QTextFormat::setProperty(iVar2,(QVariant *)0x1040);
  ::QVariant::~QVariant(&local_48);
  QTextCursor::setBlockFormat((QTextBlockFormat *)&this->cursor);
  QTextCursor::createList((QTextListFormat *)&this->cursor);
  QTextCursor::endEditBlock();
  QTextFormat::~QTextFormat((QTextFormat *)&local_68);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::createAutoBulletList()
{
    cursor.beginEditBlock();

    QTextBlockFormat blockFmt = cursor.blockFormat();

    QTextListFormat listFmt;
    listFmt.setStyle(QTextListFormat::ListDisc);
    listFmt.setIndent(blockFmt.indent() + 1);

    blockFmt.setIndent(0);
    cursor.setBlockFormat(blockFmt);

    cursor.createList(listFmt);

    cursor.endEditBlock();
}